

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media-adv.c
# Opt level: O2

void la_media_adv_format_text(la_vstring *vstr,void *data,int indent)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  size_t i;
  size_t sVar5;
  
  if (*data == '\x01') {
    la_vstring_append_sprintf
              (vstr,"%*s-- Unparseable Media Advisory message\n",(ulong)(uint)indent,"");
    return;
  }
  la_vstring_append_sprintf
            (vstr,"%*sMedia Advisory, version %d:\n",(ulong)(uint)indent,"",
             (ulong)*(byte *)((long)data + 1));
  uVar4 = indent + 1;
  pcVar1 = get_link_description(*(char *)((long)data + 6));
  pcVar3 = "lost";
  if (*(char *)((long)data + 5) == 'E') {
    pcVar3 = "established";
  }
  la_vstring_append_sprintf
            (vstr,"%*sLink %s %s at %02d:%02d:%02d UTC\n",(ulong)uVar4,"",pcVar1,pcVar3,
             (ulong)*(byte *)((long)data + 2),(ulong)*(byte *)((long)data + 3),
             (ulong)*(byte *)((long)data + 4));
  la_vstring_append_sprintf(vstr,"%*sAvailable links: ",(ulong)uVar4,"");
  sVar2 = strlen((char *)**(undefined8 **)((long)data + 8));
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    pcVar1 = get_link_description(*(char *)(**(long **)((long)data + 8) + sVar5));
    pcVar3 = "%s, ";
    if (sVar2 - 1 == sVar5) {
      pcVar3 = "%s\n";
    }
    la_vstring_append_sprintf(vstr,pcVar3,pcVar1);
  }
  if ((*(char **)((long)data + 0x10) != (char *)0x0) && (**(char **)((long)data + 0x10) != '\0')) {
    la_vstring_append_sprintf(vstr,"%*sText: %s\n",(ulong)uVar4,"");
    return;
  }
  return;
}

Assistant:

void la_media_adv_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_media_adv_msg const *msg = data;

	if(msg->err == true) {
		LA_ISPRINTF(vstr, indent, "-- Unparseable Media Advisory message\n");
		return;
	}

	LA_ISPRINTF(vstr, indent, "Media Advisory, version %d:\n", msg->version);
	indent++;

	LA_ISPRINTF(vstr, indent, "Link %s %s at %02d:%02d:%02d UTC\n",
			get_link_description(msg->current_link),
			(msg->state == 'E') ? "established" : "lost",
			msg->hour, msg->minute, msg->second
			);

	LA_ISPRINTF(vstr, indent, "Available links: ");
	size_t count = strlen(msg->available_links->str);
	for(size_t i = 0; i < count; i++) {
		char const *link = get_link_description(msg->available_links->str[i]);
		if(i == count - 1) {
			la_vstring_append_sprintf(vstr, "%s\n", link);
		} else {
			la_vstring_append_sprintf(vstr, "%s, ", link);
		}
	}

	if(msg->text != NULL && msg->text[0] != '\0') {
		LA_ISPRINTF(vstr, indent, "Text: %s\n", msg->text);
	}
}